

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

ForNonEnum<nonstd::expected_lite::unexpected_type<int>,_std::string> * __thiscall
lest::make_enum_string<nonstd::expected_lite::unexpected_type<int>>
          (ForNonEnum<nonstd::expected_lite::unexpected_type<int>,_std::string>
           *__return_storage_ptr__,lest *this,unexpected_type<int> *item)

{
  size_type sVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong *local_e8;
  ulong local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  ulong *local_a8;
  size_type local_a0;
  ulong local_98;
  undefined8 uStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"[type: ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_b8 = *puVar5;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar5;
    local_c8 = (ulong *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  make_memory_string_abi_cxx11_(&local_48,this,(void *)0x4,(size_t)puVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    uStack_90 = local_48.field_2._8_8_;
    local_48._M_dataplus._M_p = (pointer)&local_98;
  }
  local_98 = local_48.field_2._M_allocated_capacity;
  local_a0 = local_48._M_string_length;
  uVar6 = 0xf;
  if (local_c8 != &local_b8) {
    uVar6 = local_b8;
  }
  local_a8 = (ulong *)local_48._M_dataplus._M_p;
  if (uVar6 < local_c0 + local_48._M_string_length) {
    uVar7 = 0xf;
    if ((ulong *)local_48._M_dataplus._M_p != &local_98) {
      uVar7 = local_48.field_2._M_allocated_capacity;
    }
    if (local_c0 + local_48._M_string_length <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_0022aee7;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_48._M_dataplus._M_p);
LAB_0022aee7:
  local_e8 = &local_d8;
  puVar5 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar5) {
    local_d8 = *puVar5;
    uStack_d0 = puVar3[3];
  }
  else {
    local_d8 = *puVar5;
    local_e8 = (ulong *)*puVar3;
  }
  sVar1 = puVar3[1];
  *puVar3 = puVar5;
  puVar3[1] = 0;
  *(undefined1 *)puVar5 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_e8 == &local_d8) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_d8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_d0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_d8;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_d8 = local_d8 & 0xffffffffffffff00;
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make_enum_string( T const & item ) -> ForNonEnum<T, std::string>
{
#if lest__cpp_rtti
    return text("[type: ") + typeid(T).name() + "]: " + make_memory_string( item );
#else
    return text("[type: (no RTTI)]: ") + make_memory_string( item );
#endif
}